

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

JavascriptBigInt *
Js::JavascriptBigInt::CreateZeroWithLength(digit_t length,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  JavascriptBigInt *this;
  undefined4 *puVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0x15;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar4,0x38bbb2);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  this->m_length = length;
  this->m_isNegative = false;
  this->m_maxLength = length;
  data.plusSize = this->m_length;
  local_58 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0x19;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  uVar7 = this->m_length;
  if (uVar7 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar4,(TrackAllocData *)0x0);
    puVar6 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00d30ca0;
      *puVar5 = 0;
    }
    uVar7 = -(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3;
    if (uVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar2) goto LAB_00d30ca0;
      *puVar5 = 0;
    }
    puVar6 = (unsigned_long *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                       (pRVar4,uVar7);
    if (puVar6 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00d30ca0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::CreateZeroWithLength(digit_t length, ScriptContext * scriptContext)
    {
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = length;
        bigintNew->m_isNegative = false;
        bigintNew->m_maxLength = length;
        bigintNew->m_digits = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), digit_t, bigintNew->m_length);
        return bigintNew;
    }